

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::SearchComponent(BoardView *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ImGuiIO *pIVar4;
  undefined8 uVar5;
  BoardView *in_RDI;
  byte bVar6;
  bool bVar7;
  float _x;
  bool this_column_active;
  bool textChanged;
  bool hasResults;
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  results;
  bool textNonEmpty;
  string searchLabel;
  string title;
  string ui_number;
  int i;
  bool search_params_changed;
  char *first_button [3];
  bool dummy;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  BoardView *in_stack_fffffffffffffe00;
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  *in_stack_fffffffffffffe08;
  ImGuiFocusedFlags in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe14;
  undefined1 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe19;
  undefined1 in_stack_fffffffffffffe1a;
  undefined1 in_stack_fffffffffffffe1b;
  undefined1 in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1d;
  undefined1 in_stack_fffffffffffffe1e;
  byte in_stack_fffffffffffffe1f;
  string *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined2 in_stack_fffffffffffffe2c;
  undefined1 in_stack_fffffffffffffe2e;
  undefined1 in_stack_fffffffffffffe2f;
  allocator<char> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  byte bVar8;
  undefined1 uVar9;
  undefined4 in_stack_fffffffffffffe54;
  string local_1a8 [80];
  string local_158 [8];
  BoardView *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff00;
  BoardView *in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff17;
  char *in_stack_ffffffffffffff18;
  string local_d8 [8];
  bool *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string local_b8;
  int local_94;
  byte local_8d;
  undefined4 in_stack_ffffffffffffff84;
  uint limit;
  char *in_stack_ffffffffffffff88;
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  BoardView *in_stack_ffffffffffffffa0;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  byte local_39;
  char (*local_38) [128];
  char (*local_30) [128];
  char (*local_28) [128];
  ImVec2 local_1c;
  ImVec2 local_14;
  undefined1 local_9;
  
  local_9 = 1;
  pIVar4 = ImGui::GetIO();
  _x = (pIVar4->DisplaySize).x / 2.0;
  iVar3 = DPI(100);
  ImVec2::ImVec2(&local_14,_x,(float)iVar3);
  ImVec2::ImVec2(&local_1c,0.5,0.0);
  ImGui::SetNextWindowPos(&local_14,0,&local_1c);
  ImGui::PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                      SUB84(in_stack_fffffffffffffe20,0));
  bVar1 = ImGui::BeginPopupModal
                    (in_stack_fffffffffffffe38,(bool *)in_stack_fffffffffffffe30,
                     CONCAT13(in_stack_fffffffffffffe2f,
                              CONCAT12(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe2c)));
  if (bVar1) {
    local_38 = in_RDI->m_search;
    local_30 = in_RDI->m_search + 1;
    local_28 = in_RDI->m_search + 2;
    local_39 = in_RDI->m_showSearch & 1;
    if ((in_RDI->m_showSearch & 1U) != 0) {
      in_RDI->m_showSearch = false;
    }
    ImVec2::ImVec2(&local_44,0.0,0.0);
    bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe00,
                          (ImVec2 *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    if (bVar1) {
      SearchCompound(in_stack_fffffffffffffe00,
                     (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      SearchCompoundNoClear
                (in_stack_fffffffffffffe00,
                 (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      SearchCompoundNoClear
                (in_stack_fffffffffffffe00,
                 (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      CenterZoomSearchResults(in_stack_fffffffffffffeb0);
      ImGui::CloseCurrentPopup();
    }
    ImGui::SameLine(0.0,-1.0);
    ImVec2::ImVec2(&local_4c,0.0,0.0);
    bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe00,
                          (ImVec2 *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    if (bVar1) {
      FindComponent(in_stack_fffffffffffffe00,
                    (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      ResetSearch(in_RDI);
    }
    ImGui::SameLine(0.0,-1.0);
    ImVec2::ImVec2(&local_54,0.0,0.0);
    bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe00,
                          (ImVec2 *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    limit = CONCAT13(SUB41((uint)in_stack_ffffffffffffff84 >> 0x18,0),
                     (uint3)(ushort)in_stack_ffffffffffffff84);
    local_8d = 0;
    bVar8 = true;
    if (!bVar1) {
      in_stack_fffffffffffffe30 = (allocator<char> *)&in_RDI->keybindings;
      in_stack_fffffffffffffe38 = &stack0xffffffffffffff87;
      std::allocator<char>::allocator();
      limit = CONCAT13(SUB41(limit >> 0x18,0),CONCAT12(1,(short)limit));
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar8,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe30);
      local_8d = 1;
      in_stack_fffffffffffffe2f =
           KeyBindings::isPressed
                     ((KeyBindings *)
                      CONCAT17(in_stack_fffffffffffffe2f,
                               CONCAT16(in_stack_fffffffffffffe2e,
                                        CONCAT24(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28
                                                ))),in_stack_fffffffffffffe20);
      bVar8 = in_stack_fffffffffffffe2f;
    }
    uVar9 = bVar8;
    if ((local_8d & 1) != 0) {
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    }
    if ((limit & 0x10000) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    }
    if ((bVar8 & 1) != 0) {
      FindComponent(in_stack_fffffffffffffe00,
                    (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      ResetSearch(in_RDI);
      ImGui::CloseCurrentPopup();
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::PushItemWidth(in_stack_fffffffffffffe14);
    ImGui::Text("ENTER: Search, ESC: Exit, TAB: next field");
    ImGui::Separator();
    bVar1 = ImGui::Checkbox(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    local_39 = (local_39 & 1) != 0 || bVar1;
    ImGui::SameLine(0.0,-1.0);
    bVar1 = ImGui::Checkbox(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    local_39 = (local_39 & 1) != 0 || bVar1;
    ImGui::SameLine(0.0,-1.0);
    Searcher::configSearchDetails(&in_RDI->searcher);
    bVar1 = ImGui::Checkbox(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    local_39 = (local_39 & 1) != 0 || bVar1;
    ImGui::Text(" Search mode: ");
    ImGui::SameLine(0.0,-1.0);
    Searcher::isMode(&in_RDI->searcher,Sub);
    bVar1 = ImGui::RadioButton(in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
    if (bVar1) {
      local_39 = 1;
      Searcher::setMode(&in_RDI->searcher,Sub);
    }
    ImGui::SameLine(0.0,-1.0);
    Searcher::isMode(&in_RDI->searcher,Prefix);
    bVar1 = ImGui::RadioButton(in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
    if (bVar1) {
      local_39 = 1;
      Searcher::setMode(&in_RDI->searcher,Prefix);
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::PushItemWidth(in_stack_fffffffffffffe14);
    Searcher::isMode(&in_RDI->searcher,Whole);
    bVar1 = ImGui::RadioButton(in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
    if (bVar1) {
      local_39 = 1;
      Searcher::setMode(&in_RDI->searcher,Whole);
    }
    ImGui::PopItemWidth();
    ImGui::Separator();
    ImGui::Columns((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffe1f,
                                    CONCAT16(in_stack_fffffffffffffe1e,
                                             CONCAT15(in_stack_fffffffffffffe1d,
                                                      CONCAT14(in_stack_fffffffffffffe1c,
                                                               CONCAT13(in_stack_fffffffffffffe1b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffe1a,
                                                  CONCAT11(in_stack_fffffffffffffe19,
                                                           in_stack_fffffffffffffe18))))))),
                   SUB41((uint)in_stack_fffffffffffffe14 >> 0x18,0));
    for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
      in_stack_fffffffffffffe20 = &local_b8;
      std::__cxx11::to_string((int)((ulong)in_RDI >> 0x20));
      std::operator+((char *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar9,in_stack_fffffffffffffe40));
      std::operator+((char *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar9,in_stack_fffffffffffffe40));
      uVar5 = std::__cxx11::string::c_str();
      ImGui::Text("%s",uVar5);
      ImGui::PushItemWidth(in_stack_fffffffffffffe14);
      bVar6 = in_RDI->m_search[local_94][0] != '\0';
      SearchPartsAndNets(in_stack_ffffffffffffff08,(char *)CONCAT17(bVar6,in_stack_ffffffffffffff00)
                         ,in_stack_fffffffffffffefc);
      bVar1 = std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::empty((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      in_stack_fffffffffffffe1f = 1;
      if (bVar1) {
        bVar1 = std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::empty
                          ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        in_stack_fffffffffffffe1f = bVar1 ^ 0xff;
      }
      bVar2 = in_stack_fffffffffffffe1f & 1;
      if (((bVar6 & 1) != 0) && (bVar2 == 0)) {
        ImGui::PushStyleColor
                  ((ImGuiCol)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (ImU32)in_stack_fffffffffffffe20);
      }
      std::__cxx11::string::c_str();
      bVar1 = ImGui::InputText((char *)CONCAT44(in_stack_fffffffffffffe54,_x),(char *)in_RDI,
                               CONCAT17(uVar9,in_stack_fffffffffffffe40),
                               (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                               (ImGuiInputTextCallback)in_stack_fffffffffffffe30,
                               (void *)CONCAT17(in_stack_fffffffffffffe2f,
                                                CONCAT16(bVar8,CONCAT24(in_stack_fffffffffffffe2c,
                                                                        in_stack_fffffffffffffe28)))
                              );
      in_stack_fffffffffffffe1e = bVar1;
      if (((bVar6 & 1) != 0) && (bVar2 == 0)) {
        ImGui::PopStyleColor((int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
      }
      in_stack_fffffffffffffe1d = ImGui::IsItemActivated();
      if ((bool)in_stack_fffffffffffffe1d) {
        in_RDI->m_active_search_column = local_94;
        local_39 = 1;
      }
      bVar7 = local_94 == in_RDI->m_active_search_column;
      if ((bVar1) || (((local_39 & 1) != 0 && (bVar7)))) {
        SearchCompound(in_stack_fffffffffffffe00,
                       (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      }
      ImGui::PopItemWidth();
      in_stack_fffffffffffffe1c = ImGui::IsItemDeactivated();
      if ((((!(bool)in_stack_fffffffffffffe1c) && (bVar7)) &&
          (in_stack_fffffffffffffe1b = ImGui::IsWindowFocused(in_stack_fffffffffffffe10),
          (bool)in_stack_fffffffffffffe1b)) &&
         ((in_stack_fffffffffffffe1a = ImGui::IsAnyItemActive(), !(bool)in_stack_fffffffffffffe1a &&
          (in_stack_fffffffffffffe19 = ImGui::IsMouseClicked(0,false),
          !(bool)in_stack_fffffffffffffe19)))) {
        ImGui::SetKeyboardFocusHere((int)in_stack_fffffffffffffe14);
      }
      ImGui::PushItemWidth(in_stack_fffffffffffffe14);
      if ((bVar6 & 1) != 0) {
        std::operator+((char *)in_RDI,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar9,in_stack_fffffffffffffe40));
        std::
        pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
        ::pair((pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08);
        SearchColumnGenerate
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88,limit);
        std::
        pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
        ::~pair((pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
                 *)in_stack_fffffffffffffe00);
        std::__cxx11::string::~string(local_158);
      }
      ImGui::PopItemWidth();
      if (local_94 == 1) {
        in_stack_fffffffffffffe14 = (float)DPI(500);
        ImGui::PushItemWidth(in_stack_fffffffffffffe14);
      }
      else if (local_94 == 2) {
        ImGui::PopItemWidth();
      }
      ImGui::NextColumn();
      std::
      pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
      ::~pair((pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
               *)in_stack_fffffffffffffe00);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    ImGui::PopItemWidth();
    ImGui::Columns((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffe1f,
                                    CONCAT16(in_stack_fffffffffffffe1e,
                                             CONCAT15(in_stack_fffffffffffffe1d,
                                                      CONCAT14(in_stack_fffffffffffffe1c,
                                                               CONCAT13(in_stack_fffffffffffffe1b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffe1a,
                                                  CONCAT11(in_stack_fffffffffffffe19,
                                                           in_stack_fffffffffffffe18))))))),
                   SUB41((uint)in_stack_fffffffffffffe14 >> 0x18,0));
    ImGui::Separator();
    in_RDI = (BoardView *)&in_RDI->keybindings;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar9,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30);
    bVar8 = KeyBindings::isPressed
                      ((KeyBindings *)
                       CONCAT17(in_stack_fffffffffffffe2f,
                                CONCAT16(bVar8,CONCAT24(in_stack_fffffffffffffe2c,
                                                        in_stack_fffffffffffffe28))),
                       in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe57);
    if ((bVar8 & 1) != 0) {
      SearchCompound(in_RDI,(char *)CONCAT17(bVar8,in_stack_fffffffffffffdf8));
      SearchCompoundNoClear(in_RDI,(char *)CONCAT17(bVar8,in_stack_fffffffffffffdf8));
      SearchCompoundNoClear(in_RDI,(char *)CONCAT17(bVar8,in_stack_fffffffffffffdf8));
      CenterZoomSearchResults(in_stack_fffffffffffffeb0);
      ImGui::CloseCurrentPopup();
    }
    ImGui::EndPopup();
  }
  ImGui::PopStyleVar((int)in_stack_fffffffffffffe14);
  return;
}

Assistant:

void BoardView::SearchComponent(void) {
	bool dummy = true;
	ImGui::SetNextWindowPos(ImVec2(ImGui::GetIO().DisplaySize.x/2, DPI(100)), 0, ImVec2(0.5f, 0.0f));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	if (ImGui::BeginPopupModal("Search for Component / Network",
	                           &dummy,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings)) {
		//		char cs[128];
		const char *first_button[] = {m_search[0], m_search[1], m_search[2]};

		bool search_params_changed = m_showSearch; //treat initiail popup reopening similar to later search option changes
		if (m_showSearch) {
			m_showSearch       = false;
			//			fprintf(stderr, "Tooltips disabled\n");
		}

		// Column 1, implied.
		//
		//
		if (ImGui::Button("Search")) {
			// FindComponent(first_button);
			SearchCompound(first_button[0]);
			SearchCompoundNoClear(first_button[1]);
			SearchCompoundNoClear(first_button[2]);
			CenterZoomSearchResults();
			ImGui::CloseCurrentPopup();
		} // search button

		ImGui::SameLine();
		if (ImGui::Button("Reset")) {
			FindComponent("");
			ResetSearch();
		} // reset button

		ImGui::SameLine();
		if (ImGui::Button("Exit") || keybindings.isPressed("CloseDialog")) {
			FindComponent("");
			ResetSearch();
			ImGui::CloseCurrentPopup();
		} // exit button

		ImGui::SameLine();
		//		ImGui::Dummy(ImVec2(DPI(200), 1));
		//		ImGui::SameLine();
		ImGui::PushItemWidth(-1);
		ImGui::Text("ENTER: Search, ESC: Exit, TAB: next field");

		{
			ImGui::Separator();
			search_params_changed |= ImGui::Checkbox("Components", &m_searchComponents);

			ImGui::SameLine();
			search_params_changed |= ImGui::Checkbox("Nets", &m_searchNets);

			ImGui::SameLine();
			search_params_changed |= ImGui::Checkbox("Including details", &searcher.configSearchDetails());

			ImGui::Text(" Search mode: ");
			ImGui::SameLine();
			if (ImGui::RadioButton("Substring", searcher.isMode(SearchMode::Sub))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Sub);
			}
			ImGui::SameLine();
			if (ImGui::RadioButton("Prefix", searcher.isMode(SearchMode::Prefix))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Prefix);
			}
			ImGui::SameLine();
			ImGui::PushItemWidth(-1);
			if (ImGui::RadioButton("Whole", searcher.isMode(SearchMode::Whole))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Whole);
			}
			ImGui::PopItemWidth();
		}

		ImGui::Separator();

		ImGui::Columns(3);

		for (int i = 0; i < 3; i++) {
			std::string ui_number   = std::to_string(i + 1); // visual UI number is 1-based unlike 0-based indexing
			std::string title       = "Item #" + ui_number;
			std::string searchLabel = "##search" + ui_number;
			ImGui::Text("%s", title.c_str());

			ImGui::PushItemWidth(-1);

			bool textNonEmpty = m_search[i][0] != '\0';                            // Text typed in the search box
			auto results      = SearchPartsAndNets(m_search[i], 30);               // Perform the search for both nets and parts
			bool hasResults   = !results.first.empty() || !results.second.empty(); // We found some nets or some parts

			if (textNonEmpty && !hasResults) ImGui::PushStyleColor(ImGuiCol_FrameBg, 0xFF6666FF);
			bool textChanged =
			    ImGui::InputText(searchLabel.c_str(),
			                     m_search[i],
			                     128,
			                     ImGuiInputTextFlags_CharsNoBlank | (m_search[0] ? ImGuiInputTextFlags_AutoSelectAll : 0));
			if (textNonEmpty && !hasResults) ImGui::PopStyleColor();
			if (ImGui::IsItemActivated()) {
				// user activates another column
				m_active_search_column = i;
				search_params_changed  = true;
			}

			bool this_column_active = i == m_active_search_column;

			if (textChanged || (search_params_changed && this_column_active)) SearchCompound(m_search[i]);

			ImGui::PopItemWidth();

			if (!ImGui::IsItemDeactivated() && this_column_active &&
			    ImGui::IsWindowFocused(ImGuiFocusedFlags_RootAndChildWindows) && !ImGui::IsAnyItemActive() &&
			    !ImGui::IsMouseClicked(0)) {
				ImGui::SetKeyboardFocusHere(-1);
			} // set keyboard focus back to active colun input-text after other type of element was clicked

			ImGui::PushItemWidth(-1);
			if (textNonEmpty) SearchColumnGenerate("##SC" + ui_number, results, m_search[i], 30);
			ImGui::PopItemWidth();
			if (i == 1)
				ImGui::PushItemWidth(DPI(500));
			else if (i == 2)
				ImGui::PopItemWidth();

			ImGui::NextColumn();
		}

		ImGui::PopItemWidth();

		ImGui::Columns(1); // reset back to single column mode
		ImGui::Separator();

		// Enter and Esc close the search:
		if (keybindings.isPressed("Accept")) {
			// SearchCompound(first_button);
			// SearchCompoundNoClear(first_button2);
			// SearchCompoundNoClear(first_button3);
			SearchCompound(m_search[0]);
			SearchCompoundNoClear(m_search[1]);
			SearchCompoundNoClear(m_search[2]);
			CenterZoomSearchResults();
			ImGui::CloseCurrentPopup();
		} // response to keyboard ENTER

		ImGui::EndPopup();
	}
	ImGui::PopStyleVar();
}